

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Container *type)

{
  bool bVar1;
  Type *type_00;
  string element_name;
  string container_kind;
  string sStack_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Typelib::Type::getName_abi_cxx11_();
  bVar1 = std::operator==(&local_c8.first,"/std/string");
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->m_namespace);
    std::__cxx11::string::assign((char *)&this->m_front);
  }
  else {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    std::__cxx11::string::string((string *)&sStack_e8,"",(allocator *)&local_48);
    getIDLBase(&local_c8,this,type_00,&sStack_e8);
    std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_c8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_c8);
    std::__cxx11::string::~string((string *)&sStack_e8);
    if ((this->m_namespace)._M_string_length == 0) {
      std::__cxx11::string::string((string *)&sStack_e8,"/",(allocator *)&local_48);
      getIDLAbsoluteNamespace(&local_c8.first,&sStack_e8,this->m_exporter);
      std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&sStack_e8);
    }
    Typelib::Container::kind_abi_cxx11_();
    Typelib::getTypename((string *)&local_c8);
    std::__cxx11::string::~string((string *)&sStack_e8);
    Typelib::Indirect::getIndirection();
    Typelib::Type::getName_abi_cxx11_();
    boost::algorithm::replace_all<std::__cxx11::string,char_const*,char[2]>
              (&sStack_e8,&Typelib::NamespaceMarkString,(char (*) [2])"_");
    boost::algorithm::replace_all<std::__cxx11::string,char[2],char[2]>
              (&sStack_e8,(char (*) [2])0x11e0ea,(char (*) [2])"_");
    std::operator+(&local_88,&local_c8.first,"_");
    std::operator+(&local_68,&local_88,&sStack_e8);
    std::operator+(&local_48,&local_68,"_");
    std::__cxx11::string::operator=((string *)&this->m_front,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
        {
            m_namespace = "";
            m_front = "string";
        }
        else
        {
            // Get the basename for "kind"
            m_namespace = getIDLBase(type.getIndirection()).first;
            // We generate all containers in orogen::Corba, even if their
            // element type is a builtin
            if (m_namespace.empty())
                m_namespace = getIDLAbsoluteNamespace("/", m_exporter);

            std::string container_kind = Typelib::getTypename(type.kind());
            std::string element_name   = type.getIndirection().getName();
            boost::replace_all(element_name, Typelib::NamespaceMarkString, "_");
            boost::replace_all(element_name, " ", "_");
            m_front = container_kind + "_" + element_name + "_";
        }

        return true;
    }